

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repair_Response_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Repair_Response_PDU::Repair_Response_PDU
          (Repair_Response_PDU *this,EntityIdentifier *ReceivingEntityID,
          EntityIdentifier *SupplyingEntityID,RepairResult RR)

{
  RepairResult RR_local;
  EntityIdentifier *SupplyingEntityID_local;
  EntityIdentifier *ReceivingEntityID_local;
  Repair_Response_PDU *this_local;
  
  Logistics_Header::Logistics_Header
            (&this->super_Logistics_Header,ReceivingEntityID,SupplyingEntityID);
  (this->super_Logistics_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Repair_Response_PDU_0032beb8;
  this->m_ui8RepairResult = (KUINT8)RR;
  this->m_ui8Padding = '\0';
  this->m_ui16Padding = 0;
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui8PDUType = '\n';
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui16PDULength = 0x1c;
  return;
}

Assistant:

Repair_Response_PDU::Repair_Response_PDU( const EntityIdentifier & ReceivingEntityID, const EntityIdentifier & SupplyingEntityID,
        RepairResult RR ) :
    Logistics_Header( ReceivingEntityID, SupplyingEntityID ),
    m_ui8Padding( 0 ),
    m_ui16Padding( 0 ),
    m_ui8RepairResult( RR )
{
    m_ui8PDUType = Repair_Response_PDU_Type;
    m_ui16PDULength = REPAIR_RESPONSE_PDU_SIZE;
}